

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_inv_txfm2d_add_4x4_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size_,int eob)

{
  byte in_CL;
  int in_EDX;
  uint8_t *in_RSI;
  __m128i temp [4];
  int lr_flip;
  int ud_flip;
  transform_1d_ssse3 col_txfm;
  transform_1d_ssse3 row_txfm;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  TX_SIZE tx_size;
  __m128i buf [4];
  int in_stack_ffffffffffffff1c;
  __m128i *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  int32_t *in_stack_ffffffffffffff30;
  int local_a0;
  int local_9c;
  transform_1d_ssse3 local_98;
  transform_1d_ssse3 local_90;
  undefined4 local_88;
  undefined4 local_84;
  int local_80;
  int local_7c;
  int8_t *local_78;
  undefined1 local_69;
  longlong local_68 [10];
  byte local_15;
  int local_14;
  uint8_t *local_10;
  
  local_69 = 0;
  local_78 = av1_inv_txfm_shift_ls[0];
  local_15 = in_CL;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_7c = get_txw_idx('\0');
  local_80 = get_txh_idx('\0');
  local_84 = 4;
  local_88 = 4;
  local_90 = lowbd_txfm_all_1d_w4_arr[local_7c][""[local_15]];
  local_98 = lowbd_txfm_all_1d_w4_arr[local_80][""[local_15]];
  get_flip_cfg(local_15,&local_9c,&local_a0);
  load_buffer_32bit_to_16bit_w4
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c);
  (*local_90)((__m128i *)local_68,(__m128i *)local_68);
  if (local_a0 == 0) {
    transpose_16bit_4x4((__m128i *)local_68,(__m128i *)local_68);
  }
  else {
    flip_buf_sse2((__m128i *)local_68,(__m128i *)&stack0xffffffffffffff18,4);
    transpose_16bit_4x4((__m128i *)&stack0xffffffffffffff18,(__m128i *)local_68);
  }
  (*local_98)((__m128i *)local_68,(__m128i *)local_68);
  round_shift_16bit_ssse3((__m128i *)local_68,4,(int)local_78[1]);
  lowbd_write_buffer_4xn_sse2((__m128i *)local_68,local_10,local_14,local_9c,4);
  return;
}

Assistant:

static void lowbd_inv_txfm2d_add_4x4_ssse3(const int32_t *input,
                                           uint8_t *output, int stride,
                                           TX_TYPE tx_type, TX_SIZE tx_size_,
                                           int eob) {
  (void)tx_size_;
  (void)eob;
  __m128i buf[4];
  const TX_SIZE tx_size = TX_4X4;
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];

  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_w4_arr[txw_idx][hitx_1d_tab[tx_type]];
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_w4_arr[txh_idx][vitx_1d_tab[tx_type]];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  load_buffer_32bit_to_16bit_w4(input, txfm_size_row, buf, txfm_size_col);
  row_txfm(buf, buf);
  if (lr_flip) {
    __m128i temp[4];
    flip_buf_sse2(buf, temp, txfm_size_col);
    transpose_16bit_4x4(temp, buf);
  } else {
    transpose_16bit_4x4(buf, buf);
  }
  col_txfm(buf, buf);
  round_shift_16bit_ssse3(buf, txfm_size_row, shift[1]);
  lowbd_write_buffer_4xn_sse2(buf, output, stride, ud_flip, txfm_size_row);
}